

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kgc.cpp
# Opt level: O2

Value * __thiscall Kgc::allocValue(Kgc *this,ValueType type)

{
  Value *pVVar1;
  
  if (this->maxObjects_ <= this->numObjects_) {
    collect(this);
  }
  pVVar1 = allocSpecial(this,type);
  pVVar1->next_ = this->firstObject_;
  this->firstObject_ = pVVar1;
  this->numObjects_ = this->numObjects_ + 1;
  this->totalObjects_[(int)type] = this->totalObjects_[(int)type] + 1;
  return pVVar1;
}

Assistant:

Value* Kgc::allocValue(ValueType type)
{
    if (numObjects_ >= maxObjects_)
    {
        collect();
    }
    
    Value *v = allocSpecial(type);
    v->next_ = firstObject_;
    firstObject_ = v;
    ++numObjects_;
    totalObjects_[(int)type]++;;
    return v;
}